

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_env.cc
# Opt level: O1

bool Rule::IsReservedBinding(string *var)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)var);
  bVar2 = true;
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)var);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)var);
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)var);
        if (iVar1 != 0) {
          iVar1 = std::__cxx11::string::compare((char *)var);
          if (iVar1 != 0) {
            iVar1 = std::__cxx11::string::compare((char *)var);
            if (iVar1 != 0) {
              iVar1 = std::__cxx11::string::compare((char *)var);
              if (iVar1 != 0) {
                iVar1 = std::__cxx11::string::compare((char *)var);
                if (iVar1 != 0) {
                  iVar1 = std::__cxx11::string::compare((char *)var);
                  if (iVar1 != 0) {
                    iVar1 = std::__cxx11::string::compare((char *)var);
                    if (iVar1 != 0) {
                      iVar1 = std::__cxx11::string::compare((char *)var);
                      bVar2 = iVar1 == 0;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return bVar2;
}

Assistant:

bool Rule::IsReservedBinding(const string& var) {
  return var == "command" ||
      var == "depfile" ||
      var == "dyndep" ||
      var == "description" ||
      var == "deps" ||
      var == "generator" ||
      var == "pool" ||
      var == "restat" ||
      var == "rspfile" ||
      var == "rspfile_content" ||
      var == "msvc_deps_prefix";
}